

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O1

void api_dynamic_suite::dynamic_first_unused_segment(void)

{
  int *first_begin;
  ulong uVar1;
  type *first_end;
  initializer_list<int> input;
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> expect;
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  allocator_type local_69;
  vector<int,_std::allocator<int>_> local_68;
  int local_50 [2];
  circular_view<int,_18446744073709551615UL> local_48;
  type local_28 [4];
  
  local_48.member.data = local_28;
  local_28[0] = 0;
  local_28[1] = 0;
  local_28[2] = 0;
  local_28[3] = 0;
  local_48.member.cap = 4;
  local_48.member.size = 0;
  local_48.member.next = 4;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x160000000b;
  input._M_len = 2;
  input._M_array = (iterator)&local_68;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_48,input);
  first_end = (int *)0x0;
  first_begin = (int *)0x0;
  if (local_48.member.size != local_48.member.cap) {
    first_begin = local_48.member.data + (local_48.member.next - local_48.member.cap);
    uVar1 = local_48.member.next - local_48.member.size;
    if (local_48.member.cap < local_48.member.next - local_48.member.size) {
      uVar1 = local_48.member.cap;
    }
    first_end = local_48.member.data + uVar1;
  }
  local_50[0] = 0;
  local_50[1] = 0;
  __l._M_len = 2;
  __l._M_array = local_50;
  std::vector<int,_std::allocator<int>_>::vector(&local_68,__l,&local_69);
  boost::detail::
  test_all_eq_impl<std::ostream,int*,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x230,"void api_dynamic_suite::dynamic_first_unused_segment()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void dynamic_first_unused_segment()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = { 11, 22 };
    auto segment = span.first_unused_segment();
    {
        std::vector<int> expect = { 0, 0 };
        BOOST_TEST_ALL_EQ(segment.data(), segment.data() + segment.size(),
                          expect.begin(), expect.end());
    }
}